

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.hpp
# Opt level: O2

void __thiscall
ableton::link::
Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>
::ImplDeleter::operator()(ImplDeleter *this)

{
  Impl *this_00;
  
  this_00 = (this->mpImpl).
            super___shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00->mSuccess == false) {
    Impl::fail(this_00);
  }
  std::
  __shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ::reset((__shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
           *)this);
  return;
}

Assistant:

void operator()()
    {
      // Notify callback that the measurement has failed if it did
      // not succeed before destruction
      if (!mpImpl->mSuccess)
      {
        mpImpl->fail();
      }
      mpImpl.reset();
    }